

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O0

Mock<bool(int)> * __thiscall
ut11::Mock<bool(int)>::GetVerifyFailTimesMessageForCount_abi_cxx11_
          (Mock<bool(int)> *this,size_t expected,size_t actual)

{
  ostream *poVar1;
  ulong in_RCX;
  stringstream local_1b0 [8];
  stringstream output;
  ostream local_1a0 [376];
  ulong local_28;
  size_t actual_local;
  size_t expected_local;
  Mock<bool_(int)> *this_local;
  
  local_28 = in_RCX;
  actual_local = actual;
  expected_local = expected;
  this_local = (Mock<bool_(int)> *)this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"Expected function to be called ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,actual_local);
  poVar1 = std::operator<<(poVar1," times was actually called ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
  std::operator<<(poVar1," times");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

std::string GetVerifyFailTimesMessageForCount(std::size_t expected, std::size_t actual) const
		{
			std::stringstream output;
			output << "Expected function to be called " << expected << " times was actually called " << actual << " times";
			return output.str();
		}